

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

bool __thiscall MathInterpreter::isNumber(MathInterpreter *this,string *s)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  pcVar3 = (s->_M_dataplus)._M_p;
  cVar1 = *pcVar3;
  if (cVar1 < ':') {
    if (cVar1 != '-' && cVar1 < '0') {
      return false;
    }
  }
  else if (0x19 < (byte)(cVar1 + 0xbfU)) {
    return false;
  }
  uVar4 = s->_M_string_length;
  if (uVar4 < 2) {
    bVar8 = true;
    uVar5 = 1;
  }
  else {
    uVar6 = 0;
    uVar5 = 1;
    uVar7 = 2;
    do {
      cVar2 = pcVar3[uVar5];
      if (('9' < cVar2) || (cVar2 < '0' && cVar2 != '.')) break;
      uVar6 = uVar6 + (cVar2 == '.');
      bVar8 = uVar7 < uVar4;
      uVar5 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar8);
    bVar8 = uVar6 < 2;
    if (1 < uVar4) {
      if ((cVar1 == '-') && (pcVar3[1] == '.')) {
        return false;
      }
      goto LAB_0010e398;
    }
  }
  if (cVar1 == '-') {
    return false;
  }
LAB_0010e398:
  if ((uVar4 == uVar5) && (bVar8)) {
    return true;
  }
  return false;
}

Assistant:

bool MathInterpreter::isNumber(string s) {
  unsigned int i = 1, count = 0;
  if (((s[0] <= '9') && (s[0] >= '0')) || ((s[0] <= 'Z') && (s[0] >= 'A'))
      || (s[0] == '-')) {
    while ((i < s.size())
        && (((s[i] <= '9') && (s[i] >= '0')) || (s[i] == '.'))) {
      if (s[i] == '.') {
        count++;
      }
      i++;
    }
    if (((s.size() >= 2) && (!((s[0] == '-') && (s[1] == '.'))))
        || ((s.size() < 2) && (!(s[0] == '-')))) {
      if ((i == s.size()) && (count <= 1)) {
        return true;
      }
    }
  }
  return false;
}